

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O0

void __thiscall QEvdevTabletManager::addDevice(QEvdevTabletManager *this,QString *deviceNode)

{
  bool bVar1;
  undefined8 uVar2;
  QString *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  __single_object handler;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QEvdevTabletManager *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QString *this_00;
  char local_68 [40];
  undefined8 local_40;
  char local_38 [32];
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevTablet();
  anon_unknown.dwarf_2b790::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_2b790::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x107253);
    QMessageLogger::QMessageLogger
              (in_RDI,in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)in_stack_ffffffffffffff68,(char *)0x107269);
    QtPrivate::asString(in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_38,"Adding device at %ls",uVar2);
    local_10 = 0;
  }
  local_40 = 0xaaaaaaaaaaaaaaaa;
  std::make_unique<QEvdevTabletHandlerThread,QString_const&,QString&>(in_RSI,(QString *)in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                      *)0x1072c9);
  if (bVar1) {
    in_stack_ffffffffffffff70 = (QEvdevTabletManager *)&in_RDI[1].context.file;
    this_00 = in_RSI;
    std::unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>::
    unique_ptr((unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                *)in_stack_ffffffffffffff70,
               (unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                *)in_stack_ffffffffffffff68);
    QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::add
              ((DeviceHandlerList<QEvdevTabletHandlerThread> *)this_00,(QString *)in_RDI,
               (unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                *)in_RSI);
    std::unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>::
    ~unique_ptr((unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                 *)in_stack_ffffffffffffff70);
    updateDeviceCount(in_stack_ffffffffffffff70);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)in_stack_ffffffffffffff68);
    QtPrivate::asString(in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_68,"evdevtablet: Failed to open tablet device %ls",uVar2);
  }
  std::unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>::
  ~unique_ptr((unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
               *)in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTabletManager::addDevice(const QString &deviceNode)
{
    qCDebug(qLcEvdevTablet, "Adding device at %ls", qUtf16Printable(deviceNode));
    auto handler = std::make_unique<QEvdevTabletHandlerThread>(deviceNode, m_spec);
    if (handler) {
        m_activeDevices.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevtablet: Failed to open tablet device %ls", qUtf16Printable(deviceNode));
    }
}